

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O1

Env * leveldb::Env::Default(void)

{
  if (Default()::env_container == '\0') {
    Default();
  }
  return (Env *)&Default::env_container;
}

Assistant:

Env* Env::Default() {
  static PosixDefaultEnv env_container;
  return env_container.env();
}